

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QMimeTypeXMLData * __thiscall
QHash<QString,_QMimeTypeXMLData>::value
          (QMimeTypeXMLData *__return_storage_ptr__,QHash<QString,_QMimeTypeXMLData> *this,
          QString *key)

{
  QMimeTypeXMLData *pQVar1;
  
  pQVar1 = valueImpl<QString>(this,key);
  if (pQVar1 == (QMimeTypeXMLData *)0x0) {
    (__return_storage_ptr__->globPatterns).d.ptr = (QString *)0x0;
    (__return_storage_ptr__->globPatterns).d.size = 0;
    (__return_storage_ptr__->iconName).d.size = 0;
    (__return_storage_ptr__->globPatterns).d.d = (Data *)0x0;
    (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
    (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->genericIconName).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->genericIconName).d.size = 0;
    (__return_storage_ptr__->localeComments).d = (Data *)0x0;
    (__return_storage_ptr__->genericIconName).d.d = (Data *)0x0;
    (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.size = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->name).d.d = (Data *)0x0;
  }
  else {
    QMimeTypeXMLData::QMimeTypeXMLData(__return_storage_ptr__,pQVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }